

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O1

void fe_tobytes(uchar *s,i32 *h)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = h[9];
  iVar2 = (((((((((((iVar1 * 0x13 + 0x1000000 >> 0x19) + *h >> 0x1a) + h[1] >> 0x19) + h[2] >> 0x1a)
                 + h[3] >> 0x19) + h[4] >> 0x1a) + h[5] >> 0x19) + h[6] >> 0x1a) + h[7] >> 0x19) +
            h[8] >> 0x1a) + iVar1 >> 0x19) * 0x13 + *h;
  uVar11 = (iVar2 >> 0x1a) + h[1];
  uVar10 = ((int)uVar11 >> 0x19) + h[2];
  uVar9 = ((int)uVar10 >> 0x1a) + h[3];
  uVar8 = ((int)uVar9 >> 0x19) + h[4];
  iVar5 = ((int)uVar8 >> 0x1a) + h[5];
  uVar7 = (iVar5 >> 0x19) + h[6];
  uVar4 = ((int)uVar7 >> 0x1a) + h[7];
  uVar3 = ((int)uVar4 >> 0x19) + h[8];
  uVar6 = ((int)uVar3 >> 0x1a) + iVar1;
  *s = (uchar)iVar2;
  s[1] = (uchar)((uint)iVar2 >> 8);
  s[2] = (uchar)((uint)iVar2 >> 0x10);
  s[3] = ((byte)((uint)iVar2 >> 0x18) & 3) + (char)uVar11 * '\x04';
  s[4] = (uchar)(uVar11 >> 6);
  s[5] = (uchar)(uVar11 >> 0xe);
  s[6] = ((byte)(uVar11 >> 0x16) & 7) + (char)uVar10 * '\b';
  s[7] = (uchar)(uVar10 >> 5);
  s[8] = (uchar)(uVar10 >> 0xd);
  s[9] = (char)uVar9 * ' ' | (byte)(uVar10 >> 0x15) & 0x1f;
  s[10] = (uchar)(uVar9 >> 3);
  s[0xb] = (uchar)(uVar9 >> 0xb);
  s[0xc] = (char)uVar8 * '@' | (byte)(uVar9 >> 0x13) & 0x3f;
  s[0xd] = (uchar)(uVar8 >> 2);
  s[0xe] = (uchar)(uVar8 >> 10);
  s[0xf] = (uchar)(uVar8 >> 0x12);
  s[0x10] = (uchar)iVar5;
  s[0x11] = (uchar)((uint)iVar5 >> 8);
  s[0x12] = (uchar)((uint)iVar5 >> 0x10);
  s[0x13] = ((byte)((uint)iVar5 >> 0x18) & 1) + (char)uVar7 * '\x02';
  s[0x14] = (uchar)(uVar7 >> 7);
  s[0x15] = (uchar)(uVar7 >> 0xf);
  s[0x16] = ((byte)(uVar7 >> 0x17) & 7) + (char)uVar4 * '\b';
  s[0x17] = (uchar)(uVar4 >> 5);
  s[0x18] = (uchar)(uVar4 >> 0xd);
  s[0x19] = (char)uVar3 * '\x10' | (byte)(uVar4 >> 0x15) & 0xf;
  s[0x1a] = (uchar)(uVar3 >> 4);
  s[0x1b] = (uchar)(uVar3 >> 0xc);
  s[0x1c] = (char)uVar6 * '@' | (byte)(uVar3 >> 0x14) & 0x3f;
  s[0x1d] = (uchar)(uVar6 >> 2);
  s[0x1e] = (uchar)(uVar6 >> 10);
  s[0x1f] = (byte)(uVar6 >> 0x12) & 0x7f;
  return;
}

Assistant:

void fe_tobytes(unsigned char *s, const fe h) {
    i32 h0 = h[0];
    i32 h1 = h[1];
    i32 h2 = h[2];
    i32 h3 = h[3];
    i32 h4 = h[4];
    i32 h5 = h[5];
    i32 h6 = h[6];
    i32 h7 = h[7];
    i32 h8 = h[8];
    i32 h9 = h[9];
    i32 q;
    i32 carry0;
    i32 carry1;
    i32 carry2;
    i32 carry3;
    i32 carry4;
    i32 carry5;
    i32 carry6;
    i32 carry7;
    i32 carry8;
    i32 carry9;
    q = (19 * h9 + (((i32) 1) << 24)) >> 25;
    q = (h0 + q) >> 26;
    q = (h1 + q) >> 25;
    q = (h2 + q) >> 26;
    q = (h3 + q) >> 25;
    q = (h4 + q) >> 26;
    q = (h5 + q) >> 25;
    q = (h6 + q) >> 26;
    q = (h7 + q) >> 25;
    q = (h8 + q) >> 26;
    q = (h9 + q) >> 25;
    /* Goal: Output h-(2^255-19)q, which is between 0 and 2^255-20. */
    h0 += 19 * q;
    /* Goal: Output h-2^255 q, which is between 0 and 2^255-20. */
    carry0 = h0 >> 26;
    h1 += carry0;
    h0 -= shift_left(carry0, 26);
    carry1 = h1 >> 25;
    h2 += carry1;
    h1 -= shift_left(carry1, 25);
    carry2 = h2 >> 26;
    h3 += carry2;
    h2 -= shift_left(carry2, 26);
    carry3 = h3 >> 25;
    h4 += carry3;
    h3 -= shift_left(carry3, 25);
    carry4 = h4 >> 26;
    h5 += carry4;
    h4 -= shift_left(carry4, 26);
    carry5 = h5 >> 25;
    h6 += carry5;
    h5 -= shift_left(carry5, 25);
    carry6 = h6 >> 26;
    h7 += carry6;
    h6 -= shift_left(carry6, 26);
    carry7 = h7 >> 25;
    h8 += carry7;
    h7 -= shift_left(carry7, 25);
    carry8 = h8 >> 26;
    h9 += carry8;
    h8 -= shift_left(carry8, 26);
    carry9 = h9 >> 25;
    h9 -= shift_left(carry9, 25);

    /* h10 = carry9 */
    /*
    Goal: Output h0+...+2^255 h10-2^255 q, which is between 0 and 2^255-20.
    Have h0+...+2^230 h9 between 0 and 2^255-1;
    evidently 2^255 h10-2^255 q = 0.
    Goal: Output h0+...+2^230 h9.
    */
    s[0] = (unsigned char) ((h0 >> 0) & 0xff);
    s[1] = (unsigned char) ((h0 >> 8) & 0xff);
    s[2] = (unsigned char) ((h0 >> 16) & 0xff);
    s[3] = (unsigned char) (((h0 >> 24) | (h1 << 2)) & 0xff);
    s[4] = (unsigned char) ((h1 >> 6) & 0xff);
    s[5] = (unsigned char) ((h1 >> 14) & 0xff);
    s[6] = (unsigned char) (((h1 >> 22) | (h2 << 3)) & 0xff);
    s[7] = (unsigned char) ((h2 >> 5) & 0xff);
    s[8] = (unsigned char) ((h2 >> 13) & 0xff);
    s[9] = (unsigned char) (((h2 >> 21) | (h3 << 5)) & 0xff);
    s[10] = (unsigned char) ((h3 >> 3) & 0xff);
    s[11] = (unsigned char) ((h3 >> 11) & 0xff);
    s[12] = (unsigned char) (((h3 >> 19) | (h4 << 6)) & 0xff);
    s[13] = (unsigned char) ((h4 >> 2) & 0xff);
    s[14] = (unsigned char) ((h4 >> 10) & 0xff);
    s[15] = (unsigned char) ((h4 >> 18) & 0xff);
    s[16] = (unsigned char) ((h5 >> 0) & 0xff);
    s[17] = (unsigned char) ((h5 >> 8) & 0xff);
    s[18] = (unsigned char) ((h5 >> 16) & 0xff);
    s[19] = (unsigned char) (((h5 >> 24) | (h6 << 1)) & 0xff);
    s[20] = (unsigned char) ((h6 >> 7) & 0xff);
    s[21] = (unsigned char) ((h6 >> 15) & 0xff);
    s[22] = (unsigned char) (((h6 >> 23) | (h7 << 3)) & 0xff);
    s[23] = (unsigned char) ((h7 >> 5) & 0xff);
    s[24] = (unsigned char) ((h7 >> 13) & 0xff);
    s[25] = (unsigned char) (((h7 >> 21) | (h8 << 4)) & 0xff);
    s[26] = (unsigned char) ((h8 >> 4) & 0xff);
    s[27] = (unsigned char) ((h8 >> 12) & 0xff);
    s[28] = (unsigned char) (((h8 >> 20) | (h9 << 6)) & 0xff);
    s[29] = (unsigned char) ((h9 >> 2) & 0xff);
    s[30] = (unsigned char) ((h9 >> 10) & 0xff);
    s[31] = (unsigned char) ((h9 >> 18) & 0xff);
}